

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFabFactory.cpp
# Opt level: O0

unique_ptr<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_>
amrex::makeEBFabFactory
          (Geometry *a_geom,BoxArray *a_ba,DistributionMapping *a_dm,
          Vector<int,_std::allocator<int>_> *a_ngrow,EBSupport a_support)

{
  IndexSpace *pIVar1;
  DistributionMapping *in_RCX;
  BoxArray *in_RDX;
  Geometry *in_RSI;
  tuple<amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_> in_RDI;
  Vector<int,_std::allocator<int>_> *in_R8;
  EBSupport *in_stack_00000010;
  Level *eb_level;
  IndexSpace *index_space;
  __uniq_ptr_impl<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>_> __args
  ;
  
  __args._M_t.
  super__Tuple_impl<0UL,_amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>
  .super__Head_base<0UL,_amrex::EBFArrayBoxFactory_*,_false>._M_head_impl =
       (tuple<amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>)
       (tuple<amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>)
       in_RDI.
       super__Tuple_impl<0UL,_amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>
       .super__Head_base<0UL,_amrex::EBFArrayBoxFactory_*,_false>._M_head_impl;
  pIVar1 = EB2::IndexSpace::top();
  (*pIVar1->_vptr_IndexSpace[2])(pIVar1,in_RSI);
  std::
  make_unique<amrex::EBFArrayBoxFactory,amrex::EB2::Level_const&,amrex::Geometry_const&,amrex::BoxArray_const&,amrex::DistributionMapping_const&,amrex::Vector<int,std::allocator<int>>const&,amrex::EBSupport&>
            ((Level *)__args._M_t.
                      super__Tuple_impl<0UL,_amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>
                      .super__Head_base<0UL,_amrex::EBFArrayBoxFactory_*,_false>._M_head_impl,in_RSI
             ,in_RDX,in_RCX,in_R8,in_stack_00000010);
  return (__uniq_ptr_data<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>,_true,_true>
          )(__uniq_ptr_data<amrex::EBFArrayBoxFactory,_std::default_delete<amrex::EBFArrayBoxFactory>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_amrex::EBFArrayBoxFactory_*,_std::default_delete<amrex::EBFArrayBoxFactory>_>
             .super__Head_base<0UL,_amrex::EBFArrayBoxFactory_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<EBFArrayBoxFactory>
makeEBFabFactory (const Geometry& a_geom,
                  const BoxArray& a_ba,
                  const DistributionMapping& a_dm,
                  const Vector<int>& a_ngrow, EBSupport a_support)
{
    const EB2::IndexSpace& index_space = EB2::IndexSpace::top();
    const EB2::Level& eb_level = index_space.getLevel(a_geom);
    return std::make_unique<EBFArrayBoxFactory>(eb_level, a_geom, a_ba, a_dm, a_ngrow, a_support);
}